

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cxx
# Opt level: O3

int __thiscall kwssys::RegExpFind::regmatch(RegExpFind *this,char *prog)

{
  byte *pbVar1;
  ushort uVar2;
  int iVar3;
  uint uVar4;
  size_t __n;
  ulong uVar5;
  long lVar6;
  char *pcVar7;
  byte bVar8;
  byte *prog_00;
  byte bVar9;
  byte *pbVar10;
  
  if (prog != (char *)0x0) {
    pbVar10 = (byte *)this->reginput;
    pbVar1 = (byte *)this->regbol;
    do {
      if ((prog == &regdummy) ||
         (uVar2 = *(ushort *)((byte *)prog + 1) << 8 | *(ushort *)((byte *)prog + 1) >> 8,
         uVar2 == 0)) {
        prog_00 = (byte *)0x0;
LAB_0015fc33:
        bVar8 = *prog;
      }
      else {
        bVar8 = *prog;
        if (bVar8 == 7) {
          prog_00 = (byte *)prog + -(ulong)uVar2;
          goto LAB_0015fc33;
        }
        prog_00 = (byte *)prog + uVar2;
      }
      if (0x54 < bVar8) {
switchD_0015fc51_caseD_c:
        pcVar7 = "RegularExpression::find(): Internal error -- memory corrupted.";
        goto LAB_0015fd54;
      }
      uVar5 = (ulong)bVar8;
      switch(uVar5) {
      case 0:
        return 1;
      case 1:
        if (pbVar10 != pbVar1) {
          return 0;
        }
        break;
      case 2:
        if (*pbVar10 != 0) {
          return 0;
        }
        break;
      case 3:
        if (*pbVar10 == 0) {
          return 0;
        }
        pbVar10 = pbVar10 + 1;
        this->reginput = (char *)pbVar10;
        break;
      case 4:
        if (*pbVar10 == 0) {
          return 0;
        }
        pcVar7 = strchr((char *)((byte *)prog + 3),(int)(char)*pbVar10);
        if (pcVar7 == (char *)0x0) {
          return 0;
        }
        goto LAB_0015fd1a;
      case 5:
        if (*pbVar10 == 0) {
          return 0;
        }
        pcVar7 = strchr((char *)((byte *)prog + 3),(int)(char)*pbVar10);
        if (pcVar7 != (char *)0x0) {
          return 0;
        }
LAB_0015fd1a:
        pbVar10 = pbVar10 + 1;
        this->reginput = (char *)pbVar10;
        break;
      case 6:
        if (*prog_00 == 6) {
          pcVar7 = this->reginput;
          do {
            iVar3 = regmatch(this,(char *)((byte *)prog + 3));
            if (iVar3 != 0) {
              return 1;
            }
            this->reginput = pcVar7;
            if (prog == &regdummy) {
              return 0;
            }
            uVar2 = *(ushort *)((byte *)prog + 1) << 8 | *(ushort *)((byte *)prog + 1) >> 8;
            if (uVar2 == 0) {
              return 0;
            }
            uVar5 = -(ulong)uVar2;
            if (*prog != 7) {
              uVar5 = (ulong)uVar2;
            }
            pbVar10 = (byte *)prog + uVar5;
            prog = (char *)((byte *)prog + uVar5);
          } while (*pbVar10 == 6);
          return 0;
        }
        prog_00 = (byte *)prog + 3;
        break;
      case 7:
      case 9:
        break;
      case 8:
        if (((byte *)prog)[3] != *pbVar10) {
          return 0;
        }
        __n = strlen((char *)((byte *)prog + 3));
        if ((1 < __n) &&
           (iVar3 = strncmp((char *)((byte *)prog + 3),(char *)pbVar10,__n), iVar3 != 0)) {
          return 0;
        }
        pbVar10 = pbVar10 + __n;
        this->reginput = (char *)pbVar10;
        break;
      case 10:
      case 0xb:
        bVar9 = 0;
        if (*prog_00 == 8) {
          bVar9 = prog_00[3];
        }
        pcVar7 = this->reginput;
        uVar4 = regrepeat(this,(char *)((byte *)prog + 3));
        if ((int)(uint)(bVar8 != 10) <= (int)uVar4) {
          lVar6 = (ulong)uVar4 + 1;
          while (((bVar9 != 0 && (bVar9 != *this->reginput)) ||
                 (iVar3 = regmatch(this,(char *)prog_00), iVar3 == 0))) {
            this->reginput = pcVar7 + lVar6 + -2;
            lVar6 = lVar6 + -1;
            if (lVar6 <= (long)(ulong)(bVar8 != 10)) {
              return 0;
            }
          }
          return 1;
        }
        return 0;
      case 0xc:
      case 0xd:
      case 0xe:
      case 0xf:
      case 0x10:
      case 0x11:
      case 0x12:
      case 0x13:
      case 0x14:
        goto switchD_0015fc51_caseD_c;
      default:
        pcVar7 = this->reginput;
        iVar3 = regmatch(this,(char *)prog_00);
        if (iVar3 == 0) {
          return 0;
        }
        if (this->regstartp[uVar5 - 0x14] == (char *)0x0) {
          this->regstartp[uVar5 - 0x14] = pcVar7;
          return 1;
        }
        return 1;
      case 0x35:
      case 0x36:
      case 0x37:
      case 0x38:
      case 0x39:
      case 0x3a:
      case 0x3b:
      case 0x3c:
      case 0x3d:
      case 0x3e:
      case 0x3f:
      case 0x40:
      case 0x41:
      case 0x42:
      case 0x43:
      case 0x44:
      case 0x45:
      case 0x46:
      case 0x47:
      case 0x48:
      case 0x49:
      case 0x4a:
      case 0x4b:
      case 0x4c:
      case 0x4d:
      case 0x4e:
      case 0x4f:
      case 0x50:
      case 0x51:
      case 0x52:
      case 0x53:
      case 0x54:
        pcVar7 = this->reginput;
        iVar3 = regmatch(this,(char *)prog_00);
        if (iVar3 == 0) {
          return 0;
        }
        if (this->regendp[uVar5 - 0x34] == (char *)0x0) {
          this->regendp[uVar5 - 0x34] = pcVar7;
          return 1;
        }
        return 1;
      }
      prog = (char *)prog_00;
    } while ((byte *)prog != (byte *)0x0);
  }
  pcVar7 = "RegularExpression::find(): Internal error -- corrupted pointers.";
LAB_0015fd54:
  puts(pcVar7);
  return 0;
}

Assistant:

int RegExpFind::regmatch(const char* prog)
{
  const char* scan; // Current node.
  const char* next; // Next node.

  scan = prog;

  while (scan != nullptr) {

    next = regnext(scan);

    switch (OP(scan)) {
      case BOL:
        if (reginput != regbol)
          return (0);
        break;
      case EOL:
        if (*reginput != '\0')
          return (0);
        break;
      case ANY:
        if (*reginput == '\0')
          return (0);
        reginput++;
        break;
      case EXACTLY: {
        size_t len;
        const char* opnd;

        opnd = OPERAND(scan);
        // Inline the first character, for speed.
        if (*opnd != *reginput)
          return (0);
        len = strlen(opnd);
        if (len > 1 && strncmp(opnd, reginput, len) != 0)
          return (0);
        reginput += len;
      } break;
      case ANYOF:
        if (*reginput == '\0' || strchr(OPERAND(scan), *reginput) == nullptr)
          return (0);
        reginput++;
        break;
      case ANYBUT:
        if (*reginput == '\0' || strchr(OPERAND(scan), *reginput) != nullptr)
          return (0);
        reginput++;
        break;
      case NOTHING:
        break;
      case BACK:
        break;
      case OPEN + 1:
      case OPEN + 2:
      case OPEN + 3:
      case OPEN + 4:
      case OPEN + 5:
      case OPEN + 6:
      case OPEN + 7:
      case OPEN + 8:
      case OPEN + 9:
      case OPEN + 10:
      case OPEN + 11:
      case OPEN + 12:
      case OPEN + 13:
      case OPEN + 14:
      case OPEN + 15:
      case OPEN + 16:
      case OPEN + 17:
      case OPEN + 18:
      case OPEN + 19:
      case OPEN + 20:
      case OPEN + 21:
      case OPEN + 22:
      case OPEN + 23:
      case OPEN + 24:
      case OPEN + 25:
      case OPEN + 26:
      case OPEN + 27:
      case OPEN + 28:
      case OPEN + 29:
      case OPEN + 30:
      case OPEN + 31:
      case OPEN + 32: {
        int no;
        const char* save;

        no = OP(scan) - OPEN;
        save = reginput;

        if (regmatch(next)) {

          //
          // Don't set startp if some later invocation of the
          // same parentheses already has.
          //
          if (regstartp[no] == nullptr)
            regstartp[no] = save;
          return (1);
        } else
          return (0);
      }
      //              break;
      case CLOSE + 1:
      case CLOSE + 2:
      case CLOSE + 3:
      case CLOSE + 4:
      case CLOSE + 5:
      case CLOSE + 6:
      case CLOSE + 7:
      case CLOSE + 8:
      case CLOSE + 9:
      case CLOSE + 10:
      case CLOSE + 11:
      case CLOSE + 12:
      case CLOSE + 13:
      case CLOSE + 14:
      case CLOSE + 15:
      case CLOSE + 16:
      case CLOSE + 17:
      case CLOSE + 18:
      case CLOSE + 19:
      case CLOSE + 20:
      case CLOSE + 21:
      case CLOSE + 22:
      case CLOSE + 23:
      case CLOSE + 24:
      case CLOSE + 25:
      case CLOSE + 26:
      case CLOSE + 27:
      case CLOSE + 28:
      case CLOSE + 29:
      case CLOSE + 30:
      case CLOSE + 31:
      case CLOSE + 32: {
        int no;
        const char* save;

        no = OP(scan) - CLOSE;
        save = reginput;

        if (regmatch(next)) {

          //
          // Don't set endp if some later invocation of the
          // same parentheses already has.
          //
          if (regendp[no] == nullptr)
            regendp[no] = save;
          return (1);
        } else
          return (0);
      }
      //              break;
      case BRANCH: {

        const char* save;

        if (OP(next) != BRANCH) // No choice.
          next = OPERAND(scan); // Avoid recursion.
        else {
          do {
            save = reginput;
            if (regmatch(OPERAND(scan)))
              return (1);
            reginput = save;
            scan = regnext(scan);
          } while (scan != nullptr && OP(scan) == BRANCH);
          return (0);
          // NOTREACHED
        }
      } break;
      case STAR:
      case PLUS: {
        char nextch;
        int no;
        const char* save;
        int min_no;

        //
        // Lookahead to avoid useless match attempts when we know
        // what character comes next.
        //
        nextch = '\0';
        if (OP(next) == EXACTLY)
          nextch = *OPERAND(next);
        min_no = (OP(scan) == STAR) ? 0 : 1;
        save = reginput;
        no = regrepeat(OPERAND(scan));
        while (no >= min_no) {
          // If it could work, try it.
          if (nextch == '\0' || *reginput == nextch)
            if (regmatch(next))
              return (1);
          // Couldn't or didn't -- back up.
          no--;
          reginput = save + no;
        }
        return (0);
      }
      //              break;
      case END:
        return (1); // Success!

      default:
        // RAISE Error, SYM(RegularExpression), SYM(Internal_Error),
        printf(
          "RegularExpression::find(): Internal error -- memory corrupted.\n");
        return 0;
    }
    scan = next;
  }

  //
  //  We get here only if there's trouble -- normally "case END" is the
  //  terminating point.
  //
  // RAISE Error, SYM(RegularExpression), SYM(Internal_Error),
  printf("RegularExpression::find(): Internal error -- corrupted pointers.\n");
  return (0);
}